

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O3

Mat * clearBg(Mat *plate)

{
  Mat *in_RSI;
  int in_R8D;
  long lVar1;
  Mat alpha;
  Mat tmp;
  _OutputArray local_3a0;
  Mat local_388 [96];
  Mat local_328 [96];
  _InputArray local_2c8 [4];
  Mat local_268 [96];
  Mat aMStack_208 [96];
  _InputArray local_1a8 [4];
  Mat local_148 [96];
  Mat local_e8 [96];
  Mat local_88 [104];
  
  cv::Mat::Mat(local_328);
  cv::Mat::Mat(local_388);
  cv::Mat::Mat(plate);
  local_1a8[0].sz.width = 0;
  local_1a8[0].sz.height = 0;
  local_1a8[0].flags = 0x1010000;
  local_2c8[0].sz.width = 0;
  local_2c8[0].sz.height = 0;
  local_2c8[0].flags = 0x2010000;
  local_2c8[0].obj = local_328;
  cv::cvtColor((cv *)local_1a8,local_2c8,(_OutputArray *)0x6,0,in_R8D);
  local_1a8[0].sz.width = 0;
  local_1a8[0].sz.height = 0;
  local_1a8[0].flags = 0x1010000;
  local_2c8[0].sz.width = 0;
  local_2c8[0].sz.height = 0;
  local_2c8[0].flags = 0x2010000;
  local_2c8[0].obj = local_388;
  local_1a8[0].obj = local_328;
  cv::threshold(local_1a8,(_OutputArray *)local_2c8,1.0,255.0,0);
  lVar1 = 0;
  do {
    cv::Mat::Mat((Mat *)((long)&local_2c8[0].flags + lVar1));
    lVar1 = lVar1 + 0x60;
  } while (lVar1 != 0x120);
  cv::split(in_RSI,(Mat *)local_2c8);
  cv::Mat::Mat((Mat *)local_1a8,(Mat *)local_2c8);
  cv::Mat::Mat(local_148,local_268);
  cv::Mat::Mat(local_e8,aMStack_208);
  cv::Mat::Mat(local_88,local_388);
  local_3a0.super__InputArray.sz.width = 0;
  local_3a0.super__InputArray.sz.height = 0;
  local_3a0.super__InputArray.flags = 0x2010000;
  local_3a0.super__InputArray.obj = plate;
  cv::merge((Mat *)local_1a8,4,&local_3a0);
  lVar1 = 0x120;
  do {
    cv::Mat::~Mat((Mat *)((long)&local_1a8[0].flags + lVar1));
    lVar1 = lVar1 + -0x60;
  } while (lVar1 != -0x60);
  lVar1 = 0xc0;
  do {
    cv::Mat::~Mat((Mat *)((long)&local_2c8[0].flags + lVar1));
    lVar1 = lVar1 + -0x60;
  } while (lVar1 != -0x60);
  cv::Mat::~Mat(local_388);
  cv::Mat::~Mat(local_328);
  return plate;
}

Assistant:

cv::Mat clearBg(cv::Mat plate) {
    cv::Mat tmp, alpha, dst;
    cv::cvtColor(plate,tmp,cv::COLOR_BGR2GRAY);
    cv::threshold(tmp,alpha,1,255,cv::THRESH_BINARY);
    cv::Mat rgb[3];
    cv::split(plate,rgb);
    cv::Mat rgba[4]={rgb[0],rgb[1],rgb[2],alpha};
    cv::merge(rgba,4,dst);
    return dst;
}